

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

int xmlRelaxNGInitTypes(void)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  int iVar4;
  xmlRelaxNGTypeFree unaff_RBX;
  
  iVar4 = 0;
  if (xmlRelaxNGTypeInitialized == '\0') {
    xmlRelaxNGRegisteredTypes = xmlHashCreate(10);
    if (xmlRelaxNGRegisteredTypes == (xmlHashTablePtr)0x0) {
      pp_Var2 = __xmlGenericError();
      p_Var1 = *pp_Var2;
      ppvVar3 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar3,"Failed to allocate sh table for Relax-NG types\n");
      iVar4 = -1;
    }
    else {
      xmlRelaxNGRegisterTypeLibrary
                ((xmlChar *)"http://www.w3.org/2001/XMLSchema-datatypes",xmlRelaxNGSchemaTypeHave,
                 xmlRelaxNGSchemaTypeCheck,xmlRelaxNGSchemaTypeCompare,xmlRelaxNGSchemaFacetCheck,
                 xmlRelaxNGSchemaFreeValue,unaff_RBX);
      iVar4 = 0;
      xmlRelaxNGRegisterTypeLibrary
                ((xmlChar *)"http://relaxng.org/ns/structure/1.0",xmlRelaxNGDefaultTypeHave,
                 xmlRelaxNGDefaultTypeCheck,xmlRelaxNGDefaultTypeCompare,(xmlRelaxNGTypeCompare)0x0,
                 (xmlRelaxNGFacetCheck)0x0,unaff_RBX);
      xmlRelaxNGTypeInitialized = '\x01';
    }
  }
  return iVar4;
}

Assistant:

int
xmlRelaxNGInitTypes(void)
{
    if (xmlRelaxNGTypeInitialized != 0)
        return (0);
    xmlRelaxNGRegisteredTypes = xmlHashCreate(10);
    if (xmlRelaxNGRegisteredTypes == NULL) {
        xmlGenericError(xmlGenericErrorContext,
                        "Failed to allocate sh table for Relax-NG types\n");
        return (-1);
    }
    xmlRelaxNGRegisterTypeLibrary(BAD_CAST
                                  "http://www.w3.org/2001/XMLSchema-datatypes",
                                  NULL, xmlRelaxNGSchemaTypeHave,
                                  xmlRelaxNGSchemaTypeCheck,
                                  xmlRelaxNGSchemaTypeCompare,
                                  xmlRelaxNGSchemaFacetCheck,
                                  xmlRelaxNGSchemaFreeValue);
    xmlRelaxNGRegisterTypeLibrary(xmlRelaxNGNs, NULL,
                                  xmlRelaxNGDefaultTypeHave,
                                  xmlRelaxNGDefaultTypeCheck,
                                  xmlRelaxNGDefaultTypeCompare, NULL,
                                  NULL);
    xmlRelaxNGTypeInitialized = 1;
    return (0);
}